

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindBuffersBaseTest::iterate(FunctionalBindBuffersBaseTest *this)

{
  GLenum pname;
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TestError *this_00;
  ulong uVar6;
  GLuint index;
  uint uVar7;
  long lVar8;
  long lVar9;
  GLuint GVar10;
  long lVar11;
  GLint max_buffers;
  GLint max_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_ids;
  vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> buffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_buffer_ids;
  uint local_250;
  GLenum local_24c;
  long local_248;
  int local_23c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> local_218;
  long local_200;
  string local_1f8;
  Enum<int,_2UL> local_1d8;
  Enum<int,_2UL> local_1c8;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  pointer local_1a8;
  ios_base local_140 [272];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  lVar8 = 0;
  local_248 = lVar9;
  do {
    local_24c = (&s_buffer_infos)[lVar8 * 5];
    pname = (&DAT_01a1d428)[lVar8 * 5];
    uVar1 = (&DAT_01a1d42c)[lVar8 * 5];
    uVar2 = (&DAT_01a1d430)[lVar8 * 5];
    local_1b8 = (undefined1  [8])glu::getBufferTargetName;
    pp_Stack_1b0 = (_func_int **)CONCAT44(pp_Stack_1b0._4_4_,local_24c);
    local_200 = lVar8;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1f8,local_1b8);
    local_250 = 0;
    local_23c = 0;
    (**(code **)(lVar9 + 0x868))(uVar1,&local_250);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x968);
    (**(code **)(lVar9 + 0x868))(uVar2,&local_23c);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x96c);
    iVar4 = local_23c / (int)local_250;
    local_218.
    super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_218.
    super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.
    super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::resize
              (&local_218,(long)(int)local_250);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_238,(long)(int)local_250);
    uVar6 = (ulong)local_250;
    if (0 < (int)local_250) {
      lVar11 = 0;
      lVar8 = 0;
      do {
        MultiBind::Buffer::InitData
                  ((Buffer *)
                   ((long)&(local_218.
                            super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar11),
                   (this->super_TestCase).m_context,local_24c,0x88ea,(long)iVar4,(GLvoid *)0x0);
        local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] =
             *(uint *)((long)&(local_218.
                               super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar11);
        lVar8 = lVar8 + 1;
        uVar6 = (ulong)(int)local_250;
        lVar11 = lVar11 + 0x18;
        lVar9 = local_248;
      } while (lVar8 < (long)uVar6);
    }
    (**(code **)(lVar9 + 0x58))
              (local_24c,0,uVar6,
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x984);
    uVar6 = (ulong)local_250;
    if (0 < (int)local_250) {
      lVar9 = 0;
      do {
        checkBinding((this->super_TestCase).m_context,pname,(GLuint)lVar9,&local_1f8,
                     local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar9]);
        lVar9 = lVar9 + 1;
        uVar6 = (ulong)(int)local_250;
      } while (lVar9 < (long)uVar6);
    }
    GVar10 = (int)(((uint)(uVar6 >> 0x1f) & 1) + (int)uVar6) >> 1;
    (**(code **)(local_248 + 0x58))(local_24c,0,GVar10,0);
    dVar5 = (**(code **)(local_248 + 0x800))();
    glu::checkError(dVar5,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x996);
    lVar9 = local_248;
    if (1 < (int)uVar6) {
      index = 0;
      do {
        checkBinding((this->super_TestCase).m_context,pname,index,&local_1f8,0);
        index = index + 1;
      } while (GVar10 != index);
    }
    if ((int)GVar10 < (int)local_250) {
      lVar8 = (long)(int)GVar10;
      do {
        checkBinding((this->super_TestCase).m_context,pname,(GLuint)lVar8,&local_1f8,
                     local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)local_250);
    }
    (**(code **)(lVar9 + 0x58))(local_24c,GVar10,local_250 - GVar10,0);
    dVar5 = (**(code **)(local_248 + 0x800))();
    glu::checkError(dVar5,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x9a3);
    lVar9 = local_248;
    if (0 < (int)local_250) {
      GVar10 = 0;
      do {
        checkBinding((this->super_TestCase).m_context,pname,GVar10,&local_1f8,0);
        GVar10 = GVar10 + 1;
      } while ((int)GVar10 < (int)local_250);
    }
    uVar7 = 1;
    while (cVar3 = (**(code **)(lVar9 + 0xc68))(uVar7), cVar3 == '\x01') {
      uVar7 = uVar7 + 1;
    }
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = uVar7;
    (**(code **)(lVar9 + 0x58))(local_24c,0,local_250);
    local_1c8.m_value = (**(code **)(lVar9 + 0x800))();
    if (local_1c8.m_value != 0x502) {
      local_1b8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x7f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", line: ",8);
      std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,0x9c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,". Got wrong error: ",0x13);
      local_1c8.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,", expected: ",0xc);
      local_1d8.m_getName = glu::getErrorName;
      local_1d8.m_value = 0x502;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", message: ",0xb)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,"BindBufferBase with invalid buffer id",0x25);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      std::ios_base::~ios_base(local_140);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x9c0);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = 0;
    if (0 < (int)local_250) {
      lVar8 = 0;
      do {
        checkBinding((this->super_TestCase).m_context,pname,(GLuint)lVar8,&local_1f8,
                     local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)local_250);
    }
    (**(code **)(lVar9 + 0x48))
              (local_24c,0,
               (local_218.
                super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                ._M_impl.super__Vector_impl_data._M_start)->m_id);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"BindBufferBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x9d1);
    checkBinding((this->super_TestCase).m_context,pname,0,&local_1f8,
                 (local_218.
                  super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_id);
    local_1b8 = (undefined1  [8])0x0;
    pp_Stack_1b0 = (_func_int **)0x0;
    local_1a8 = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,(long)(int)local_250
              );
    (**(code **)(lVar9 + 0x58))(local_24c,0,1,local_1b8);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x9d8);
    uVar6 = (ulong)local_250;
    if (0 < (int)local_250) {
      lVar8 = 0;
      do {
        checkBinding((this->super_TestCase).m_context,pname,(GLuint)lVar8,&local_1f8,
                     local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar8]);
        lVar8 = lVar8 + 1;
        uVar6 = (ulong)(int)local_250;
      } while (lVar8 < (long)uVar6);
    }
    (**(code **)(lVar9 + 0x58))(local_24c,0,uVar6,0);
    if (local_1b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
    }
    if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::~vector
              (&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    lVar8 = local_200 + 1;
  } while (lVar8 != 4);
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindBuffersBaseTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	for (size_t i = 0; i < s_n_buffer_tragets; ++i)
	{
		const GLenum	   pname_binding  = s_buffer_infos[i].m_pname_binding;
		const GLenum	   pname_max	  = s_buffer_infos[i].m_pname_max;
		const GLenum	   pname_max_size = s_buffer_infos[i].m_pname_max_size;
		const GLenum	   target		  = s_buffer_infos[i].m_target;
		const std::string& target_name	= glu::getBufferTargetStr(target).toString();

		GLint max_buffers = 0;
		GLint max_size	= 0;

		/* Get max */
		gl.getIntegerv(pname_max, &max_buffers);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		/* Get max size */
		gl.getIntegerv(pname_max_size, &max_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		GLintptr buffer_size = max_size / max_buffers;

		/* Storage */
		std::vector<Buffer> buffer;
		std::vector<GLuint> buffer_ids;

		buffer.resize(max_buffers);
		buffer_ids.resize(max_buffers);

		/* Prepare buffers */
		for (GLint j = 0; j < max_buffers; ++j)
		{
			buffer[j].InitData(m_context, target, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

			buffer_ids[j] = buffer[j].m_id;
		}

		/*
		 * - execute BindBufferBase to bind all buffers to tested target;
		 * - inspect if bindings were modified;
		 */
		gl.bindBuffersBase(target, 0 /* first */, max_buffers /* count */, &buffer_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		/*
		 *
		 * - execute BindBufferBase for first half of bindings with NULL as <buffers>
		 * to unbind first half of bindings for tested target;
		 * - inspect if bindings were modified;
		 * - execute BindBufferBase for second half of bindings with NULL as <buffers>
		 * to unbind rest of bindings;
		 * - inspect if bindings were modified;
		 */
		GLint half_index = max_buffers / 2;
		gl.bindBuffersBase(target, 0 /* first */, half_index /* count */, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < half_index; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, 0);
		}

		for (GLint j = half_index; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		gl.bindBuffersBase(target, half_index /* first */, max_buffers - half_index /* count */, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, 0);
		}

		/*
		 * - change <buffers> so first entry is invalid;
		 * - execute BindBufferBase to bind all buffers to tested target; It is
		 * expected that INVALID_OPERATION will be generated;
		 * - inspect if all bindings but first were modified;
		 */

		/* Find invalid id */
		GLuint invalid_id = 1;
		while (1)
		{
			if (GL_TRUE != gl.isBuffer(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		buffer_ids[0] = invalid_id;

		gl.bindBuffersBase(target, 0 /* first */, max_buffers /* count */, &buffer_ids[0]);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindBufferBase with invalid buffer id");

		/* Update buffer_ids */
		buffer_ids[0] = 0; /* 0 means unbound */

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		/*
		 * - bind any buffer to first binding;
		 * - execute BindBufferBase for 0 as <first>, 1 as <count> and <buffers> filled
		 * with zeros to unbind 1st binding for tested target;
		 * - inspect if bindings were modified;
		 */
		gl.bindBufferBase(target, 0, buffer[0].m_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferBase");
		checkBinding(m_context, pname_binding, 0, target_name, buffer[0].m_id);

		std::vector<GLuint> t_buffer_ids;
		t_buffer_ids.resize(max_buffers);

		gl.bindBuffersBase(target, 0 /* first */, 1 /* count */, &t_buffer_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		/* - unbind all buffers. */
		gl.bindBuffersBase(target, 0 /* first */, max_buffers /* count */, 0);
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}